

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSwitch
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Switch *curr)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Name *pNVar4;
  undefined1 local_120 [8];
  Name target;
  int64_t index;
  undefined4 local_bc;
  Flow local_b8;
  undefined1 local_60 [8];
  Literals values;
  Switch *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *flow;
  
  values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  Flow::Flow(__return_storage_ptr__);
  Literals::Literals((Literals *)local_60);
  if (curr->value != (Expression *)0x0) {
    visit(&local_b8,this,curr->value);
    Flow::operator=(__return_storage_ptr__,&local_b8);
    Flow::~Flow(&local_b8);
    bVar1 = Flow::breaking(__return_storage_ptr__);
    if (bVar1) goto LAB_002d34a2;
    Literals::operator=((Literals *)local_60,&__return_storage_ptr__->values);
  }
  visit((Flow *)&index,this,curr->condition);
  Flow::operator=(__return_storage_ptr__,(Flow *)&index);
  Flow::~Flow((Flow *)&index);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (!bVar1) {
    Flow::getSingleValue(__return_storage_ptr__);
    pcVar2 = (char *)::wasm::Literal::getInteger();
    local_120 = (undefined1  [8])(curr->default_).super_IString.str._M_len;
    target.super_IString.str._M_len = (size_t)(curr->default_).super_IString.str._M_str;
    target.super_IString.str._M_str = pcVar2;
    if ((-1 < (long)pcVar2) &&
       (pcVar3 = (char *)ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                                   (&(curr->targets).
                                     super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
       pcVar2 < pcVar3)) {
      pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(curr->targets).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (size_t)target.super_IString.str._M_str);
      Name::operator=((Name *)local_120,pNVar4);
    }
    Name::operator=(&__return_storage_ptr__->breakTo,(Name *)local_120);
    Literals::operator=(&__return_storage_ptr__->values,(Literals *)local_60);
  }
LAB_002d34a2:
  values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  local_bc = 1;
  Literals::~Literals((Literals *)local_60);
  if ((values.super_SmallVector<wasm::Literal,_1UL>.flexible.
       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Flow::~Flow(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitSwitch(Switch* curr) {
    NOTE_ENTER("Switch");
    Flow flow;
    Literals values;
    if (curr->value) {
      flow = visit(curr->value);
      if (flow.breaking()) {
        return flow;
      }
      values = flow.values;
    }
    flow = visit(curr->condition);
    if (flow.breaking()) {
      return flow;
    }
    int64_t index = flow.getSingleValue().getInteger();
    Name target = curr->default_;
    if (index >= 0 && (size_t)index < curr->targets.size()) {
      target = curr->targets[(size_t)index];
    }
    flow.breakTo = target;
    flow.values = values;
    return flow;
  }